

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O3

int emit_table_size(nghttp2_bufs *bufs,size_t table_size)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  byte *pbVar4;
  size_t len;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint8_t sb [16];
  byte local_18;
  byte local_17 [23];
  
  if (table_size < 0x1f) {
    local_18 = (byte)table_size | 0x20;
    len = 1;
  }
  else {
    uVar7 = table_size - 0x1f;
    if (uVar7 < 0x80) {
      pbVar4 = local_17;
      len = 2;
    }
    else {
      uVar3 = uVar7;
      uVar6 = 0;
      do {
        uVar5 = uVar6;
        uVar6 = uVar5 + 1;
        bVar1 = 0x3fff < uVar3;
        uVar3 = uVar3 >> 7;
      } while (bVar1);
      if (0xe < uVar6) {
        return -0x20b;
      }
      len = uVar5 + 3;
      pbVar4 = local_17;
      uVar3 = uVar7;
      if (0x7f < uVar7) {
        do {
          *pbVar4 = (byte)uVar3 | 0x80;
          uVar7 = uVar3 >> 7;
          pbVar4 = pbVar4 + 1;
          bVar1 = 0x3fff < uVar3;
          uVar3 = uVar7;
        } while (bVar1);
      }
    }
    local_18 = 0x3f;
    *pbVar4 = (byte)uVar7;
  }
  iVar2 = nghttp2_bufs_add(bufs,&local_18,len);
  return iVar2;
}

Assistant:

static int emit_table_size(nghttp2_bufs *bufs, size_t table_size) {
  int rv;
  uint8_t *bufp;
  size_t blocklen;
  uint8_t sb[16];

  DEBUGF("deflatehd: emit table_size=%zu\n", table_size);

  blocklen = count_encoded_length(table_size, 5);

  if (sizeof(sb) < blocklen) {
    return NGHTTP2_ERR_HEADER_COMP;
  }

  bufp = sb;

  *bufp = 0x20u;

  encode_length(bufp, table_size, 5);

  rv = nghttp2_bufs_add(bufs, sb, blocklen);
  if (rv != 0) {
    return rv;
  }

  return 0;
}